

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::local_m_map_t::bounds(local_m_map_t *this,loc_id_t id,map_t *M)

{
  if (this->_loc_nb <= id) {
    __assert_fail("id < _loc_nb",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                  ,0x1c8,
                  "void tchecker::clockbounds::local_m_map_t::bounds(tchecker::loc_id_t, tchecker::clockbounds::map_t &) const"
                 );
  }
  if ((M->super_array_capacity_t<unsigned_int>)._capacity == this->_clock_nb) {
    clockbounds::clear(M);
    update(M,(this->_M).
             super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[id]);
    return;
  }
  __assert_fail("M.capacity() == _clock_nb",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/clockbounds.cc"
                ,0x1c9,
                "void tchecker::clockbounds::local_m_map_t::bounds(tchecker::loc_id_t, tchecker::clockbounds::map_t &) const"
               );
}

Assistant:

void local_m_map_t::bounds(tchecker::loc_id_t id, tchecker::clockbounds::map_t & M) const
{
  assert(id < _loc_nb);
  assert(M.capacity() == _clock_nb);
  tchecker::clockbounds::clear(M);
  tchecker::clockbounds::update(M, *_M[id]);
}